

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

_Bool do_cmd_close_test(loc_conflict grid)

{
  _Bool _Var1;
  square_conflict *psVar2;
  loc_conflict grid_local;
  
  _Var1 = square_isknown((chunk *)cave,grid);
  if (_Var1) {
    _Var1 = square_isopendoor((chunk *)cave,grid);
    if ((!_Var1) && (_Var1 = square_isbrokendoor((chunk *)cave,grid), !_Var1)) {
      msg("You see nothing there to close.");
      return false;
    }
    psVar2 = square((chunk *)cave,grid);
    if (psVar2->mon < 0) {
      msg("You\'re standing in that doorway.");
      grid_local.x._3_1_ = false;
    }
    else {
      grid_local.x._3_1_ = true;
    }
  }
  else {
    msg("You see nothing there.");
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool do_cmd_close_test(struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		/* Message */
		msg("You see nothing there.");

		/* Nope */
		return (false);
	}

 	/* Require open/broken door */
	if (!square_isopendoor(cave, grid) && !square_isbrokendoor(cave, grid)) {
		/* Message */
		msg("You see nothing there to close.");

		/* Nope */
		return (false);
	}

	/* Don't allow if player is in the way. */
	if (square(cave, grid)->mon < 0) {
		/* Message */
		msg("You're standing in that doorway.");

		/* Nope */
		return (false);
	}

	/* Okay */
	return (true);
}